

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O1

int __thiscall
DIS::ElectromagneticEmissionSystemData::getMarshalledSize(ElectromagneticEmissionSystemData *this)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pEVar4;
  long lVar5;
  ulong uVar6;
  ElectromagneticEmissionBeamData listElement;
  ElectromagneticEmissionBeamData local_b0;
  
  iVar2 = EmitterSystem::getMarshalledSize(&this->_emitterSystem);
  iVar3 = Vector3Float::getMarshalledSize(&this->_location);
  iVar2 = iVar2 + iVar3 + 4;
  pEVar4 = (this->_beamDataRecords).
           super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_beamDataRecords).
      super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar4) {
    lVar5 = 0x68;
    uVar6 = 0;
    do {
      local_b0._vptr_ElectromagneticEmissionBeamData =
           (_func_int **)&PTR__ElectromagneticEmissionBeamData_001b4360;
      local_b0._8_4_ = *(undefined4 *)((long)pEVar4 + lVar5 + -0x60);
      local_b0._fundamentalParameterData._vptr_EEFundamentalParameterData =
           (_func_int **)&PTR__EEFundamentalParameterData_001b42d0;
      local_b0._fundamentalParameterData._pulseWidth = *(float *)((long)pEVar4 + lVar5 + -0x40);
      puVar1 = (undefined8 *)((long)pEVar4 + lVar5 + -0x50);
      local_b0._fundamentalParameterData._8_8_ = *puVar1;
      local_b0._fundamentalParameterData._16_8_ = puVar1[1];
      local_b0._beamData._vptr_BeamData = (_func_int **)&PTR__BeamData_001b3b10;
      local_b0._beamData._beamSweepSync = *(float *)((long)pEVar4 + lVar5 + -0x20);
      puVar1 = (undefined8 *)((long)pEVar4 + lVar5 + -0x30);
      local_b0._beamData._8_8_ = *puVar1;
      local_b0._beamData._16_8_ = puVar1[1];
      local_b0._80_4_ = *(undefined4 *)((long)pEVar4 + lVar5 + -0x18);
      local_b0._jammingTechnique._vptr_JammingTechnique =
           (_func_int **)&PTR__JammingTechnique_001b5070;
      local_b0._jammingTechnique._8_4_ = *(undefined4 *)((long)pEVar4 + lVar5 + -8);
      std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::vector
                (&local_b0._trackJamTargets,
                 (vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_> *)
                 ((long)&pEVar4->_vptr_ElectromagneticEmissionBeamData + lVar5));
      iVar3 = ElectromagneticEmissionBeamData::getMarshalledSize(&local_b0);
      iVar2 = iVar2 + iVar3;
      ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&local_b0);
      uVar6 = uVar6 + 1;
      pEVar4 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x80;
    } while (uVar6 < (ulong)((long)(this->_beamDataRecords).
                                   super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 7));
  }
  return iVar2;
}

Assistant:

int ElectromagneticEmissionSystemData::getMarshalledSize() const
{
    int marshalSize = 0;

    marshalSize += 1;  // _systemDataLength
    marshalSize += 1;  // _numberOfBeams
    marshalSize += 2;  // _eimssionsPadding2
    marshalSize += _emitterSystem.getMarshalledSize(); //_emitterSystem
    marshalSize += _location.getMarshalledSize(); //_location

    for(unsigned long long idx=0; idx < _beamDataRecords.size(); idx++)
    {
        ElectromagneticEmissionBeamData listElement = _beamDataRecords[idx];
        marshalSize += listElement.getMarshalledSize();
    }

    return marshalSize;
}